

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refdbm.cc
# Opt level: O2

bool tchecker::refdbm::has_fixed_value(db_t *rdbm,reference_clock_variables_t *r,clock_id_t x)

{
  bool bVar1;
  size_t sVar2;
  uint uVar3;
  
  if (rdbm == (db_t *)0x0) {
    __assert_fail("rdbm != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x390,
                  "bool tchecker::refdbm::has_fixed_value(const tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &, tchecker::clock_id_t)"
                 );
  }
  bVar1 = is_consistent(rdbm,r);
  if (!bVar1) {
    __assert_fail("tchecker::refdbm::is_consistent(rdbm, r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x391,
                  "bool tchecker::refdbm::has_fixed_value(const tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &, tchecker::clock_id_t)"
                 );
  }
  bVar1 = is_tight(rdbm,r);
  if (!bVar1) {
    __assert_fail("tchecker::refdbm::is_tight(rdbm, r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x392,
                  "bool tchecker::refdbm::has_fixed_value(const tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &, tchecker::clock_id_t)"
                 );
  }
  sVar2 = index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size((index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)r);
  if (x < sVar2) {
    sVar2 = index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::size((index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)r);
    uVar3 = 0;
    if (r->_refcount <= x) {
      uVar3 = (r->_refmap).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[x];
    }
    if ((((uint)rdbm[(int)sVar2 * x + uVar3] & 1) == 0) ||
       (((uint)rdbm[uVar3 * (int)sVar2 + x] & 1) == 0)) {
      bVar1 = false;
    }
    else {
      bVar1 = ((int)rdbm[(int)sVar2 * x + uVar3] >> 1) + ((int)rdbm[uVar3 * (int)sVar2 + x] >> 1) ==
              0;
    }
    return bVar1;
  }
  __assert_fail("x < r.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                ,0x393,
                "bool tchecker::refdbm::has_fixed_value(const tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &, tchecker::clock_id_t)"
               );
}

Assistant:

bool has_fixed_value(tchecker::dbm::db_t const * rdbm, tchecker::reference_clock_variables_t const & r, tchecker::clock_id_t x)
{
  assert(rdbm != nullptr);
  assert(tchecker::refdbm::is_consistent(rdbm, r));
  assert(tchecker::refdbm::is_tight(rdbm, r));
  assert(x < r.size());

  tchecker::clock_id_t const rdim = r.size();
  tchecker::clock_id_t const rx = (x < r.refcount() ? 0 : r.refmap()[x]);

  return (tchecker::dbm::comparator(RDBM(x, rx)) == tchecker::LE) && (tchecker::dbm::comparator(RDBM(rx, x)) == tchecker::LE) &&
         (tchecker::dbm::value(RDBM(rx, x)) == -tchecker::dbm::value(RDBM(x, rx)));
}